

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

bool __thiscall BanMan::IsDiscouraged(BanMan *this,CNetAddr *net_addr)

{
  long lVar1;
  byte bVar2;
  AnnotatedMixin<std::mutex> *in_RSI;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock5;
  Mutex *in_stack_ffffffffffffff78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined8 in_stack_ffffffffffffff98;
  CRollingBloomFilter *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  Span<const_unsigned_char> in_stack_ffffffffffffffc0;
  CNetAddr *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RDI,in_RSI,in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff98 >> 0x18,0));
  CNetAddr::GetAddrBytes(in_stack_ffffffffffffffd8);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),in_stack_ffffffffffffff80
             ,in_stack_ffffffffffffff78);
  bVar2 = CRollingBloomFilter::contains(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffc0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(bVar2,in_stack_ffffffffffffff88));
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BanMan::IsDiscouraged(const CNetAddr& net_addr)
{
    LOCK(m_banned_mutex);
    return m_discouraged.contains(net_addr.GetAddrBytes());
}